

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

size_t __thiscall Assimp::CFIReaderImpl::parseInt2(CFIReaderImpl *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  DeadlyImportError *this_00;
  size_t result;
  uint8_t b;
  CFIReaderImpl *this_local;
  
  pbVar4 = this->dataP;
  this->dataP = pbVar4 + 1;
  bVar1 = *pbVar4;
  if ((bVar1 & 0x40) == 0) {
    return (long)(int)(bVar1 & 0x3f);
  }
  if ((bVar1 & 0x60) == 0x40) {
    if (0 < (long)this->dataEnd - (long)this->dataP) {
      pbVar4 = this->dataP;
      this->dataP = pbVar4 + 1;
      return (long)(int)(((bVar1 & 0x1f) << 8 | (uint)*pbVar4) + 0x40);
    }
  }
  else if (((bVar1 & 0x70) == 0x60) && (1 < (long)this->dataEnd - (long)this->dataP)) {
    bVar2 = *this->dataP;
    bVar3 = this->dataP[1];
    this->dataP = this->dataP + 2;
    return (long)(int)(((bVar1 & 0xf) << 0x10 | (uint)bVar2 << 8 | (uint)bVar3) + 0x2040);
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

size_t parseInt2() { // C.25
        uint8_t b = *dataP++;
        if (!(b & 0x40)) { // x0...... (C.25.2)
            return b & 0x3f;
        }
        else if ((b & 0x60) == 0x40) { // x10..... ........ (C.25.3)
            if (dataEnd - dataP > 0) {
                return (((b & 0x1f) << 8) | *dataP++) + 0x40;
            }
        }
        else if ((b & 0x70) == 0x60) { // x110.... ........ ........ (C.25.4)
            if (dataEnd - dataP > 1) {
                size_t result = (((b & 0x0f) << 16) | (dataP[0] << 8) | dataP[1]) + 0x2040;
                dataP += 2;
                return result;
            }
        }
        throw DeadlyImportError(parseErrorMessage);
    }